

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

bool __thiscall pbrt::SquareMatrix<3>::IsIdentity(SquareMatrix<3> *this)

{
  float fVar1;
  Float (*paFVar2) [3];
  ulong uVar3;
  int j;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar3 = 0;
  bVar5 = false;
  paFVar2 = (Float (*) [3])this;
  do {
    uVar4 = 0;
    do {
      if (uVar3 == uVar4) {
        fVar1 = *(float *)((long)this->m + uVar3 * 0x10);
        bVar6 = fVar1 == 1.0;
      }
      else {
        fVar1 = (*(Float (*) [3])*paFVar2)[uVar4];
        bVar6 = fVar1 == 0.0;
      }
      if (!bVar6) {
        return bVar5;
      }
      if (NAN(fVar1)) {
        return bVar5;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
    bVar5 = 1 < uVar3;
    uVar3 = uVar3 + 1;
    paFVar2 = paFVar2 + 1;
    if (uVar3 == 3) {
      return true;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool IsIdentity() const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (i == j) {
                    if (m[i][j] != 1)
                        return false;
                } else if (m[i][j] != 0)
                    return false;
            }
        return true;
    }